

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

FT_Error tt_size_ready_bytecode(TT_Size size,FT_Bool pedantic)

{
  FT_Face pFVar1;
  FT_Int32 FVar2;
  TT_Face face;
  int local_18;
  FT_UInt i;
  FT_Error error;
  FT_Bool pedantic_local;
  TT_Size size_local;
  
  if (size->bytecode_ready < 0) {
    local_18 = tt_size_init_bytecode(&size->root,pedantic);
  }
  else {
    local_18 = size->bytecode_ready;
  }
  if (local_18 == 0) {
    if (size->cvt_ready < 0) {
      pFVar1 = (size->root).face;
      for (face._4_4_ = 0; (ulong)face._4_4_ < size->cvt_size; face._4_4_ = face._4_4_ + 1) {
        FVar2 = FT_MulFix_x86_64((int)*(short *)(pFVar1[4].generic.finalizer + (ulong)face._4_4_ * 2
                                                ),(FT_Int32)(size->ttmetrics).scale);
        size->cvt[face._4_4_] = (long)FVar2;
      }
      for (face._4_4_ = 0; face._4_4_ < (size->twilight).n_points; face._4_4_ = face._4_4_ + 1) {
        (size->twilight).org[face._4_4_].x = 0;
        (size->twilight).org[face._4_4_].y = 0;
        (size->twilight).cur[face._4_4_].x = 0;
        (size->twilight).cur[face._4_4_].y = 0;
      }
      for (face._4_4_ = 0; face._4_4_ < size->storage_size; face._4_4_ = face._4_4_ + 1) {
        size->storage[face._4_4_] = 0;
      }
      memcpy(&size->GS,&tt_default_graphics_state,0x60);
      local_18 = tt_size_run_prep(size,pedantic);
    }
    else {
      local_18 = size->cvt_ready;
    }
  }
  return local_18;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_ready_bytecode( TT_Size  size,
                          FT_Bool  pedantic )
  {
    FT_Error  error = FT_Err_Ok;


    if ( size->bytecode_ready < 0 )
      error = tt_size_init_bytecode( (FT_Size)size, pedantic );
    else
      error = size->bytecode_ready;

    if ( error )
      goto Exit;

    /* rescale CVT when needed */
    if ( size->cvt_ready < 0 )
    {
      FT_UInt  i;
      TT_Face  face = (TT_Face)size->root.face;


      /* Scale the cvt values to the new ppem.          */
      /* We use by default the y ppem to scale the CVT. */
      for ( i = 0; i < size->cvt_size; i++ )
        size->cvt[i] = FT_MulFix( face->cvt[i], size->ttmetrics.scale );

      /* all twilight points are originally zero */
      for ( i = 0; i < (FT_UInt)size->twilight.n_points; i++ )
      {
        size->twilight.org[i].x = 0;
        size->twilight.org[i].y = 0;
        size->twilight.cur[i].x = 0;
        size->twilight.cur[i].y = 0;
      }

      /* clear storage area */
      for ( i = 0; i < (FT_UInt)size->storage_size; i++ )
        size->storage[i] = 0;

      size->GS = tt_default_graphics_state;

      error = tt_size_run_prep( size, pedantic );
    }
    else
      error = size->cvt_ready;

  Exit:
    return error;
  }